

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFeatureElementAddition,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcFeatureElementAddition *in;
  
  in = (IfcFeatureElementAddition *)operator_new(0x170);
  *(undefined ***)&(in->super_IfcFeatureElement).field_0x158 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x160 = 0;
  *(char **)&in->field_0x168 = "IfcFeatureElementAddition";
  Assimp::IFC::Schema_2x3::IfcFeatureElement::IfcFeatureElement
            ((IfcFeatureElement *)in,&PTR_construction_vtable_24__00878310);
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject =
       &PTR__IfcFeatureElementAddition_008781e0;
  *(undefined ***)&(in->super_IfcFeatureElement).field_0x158 =
       &PTR__IfcFeatureElementAddition_008782f8;
  *(undefined ***)
   &(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcFeatureElementAddition_00878208;
  (in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFeatureElementAddition_00878230;
  *(undefined ***)
   &(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcFeatureElementAddition_00878258;
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.field_0x100 =
       &PTR__IfcFeatureElementAddition_00878280;
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.field_0x138 =
       &PTR__IfcFeatureElementAddition_008782a8;
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.field_0x148 =
       &PTR__IfcFeatureElementAddition_008782d0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFeatureElementAddition>(db,params,in);
  return (Object *)
         (&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x0
         + *(long *)(*(long *)&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.
                               super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }